

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureTests.cpp
# Opt level: O1

IterateResult __thiscall
gl4cts::SparseTextureCommitmentTestCase::iterate(SparseTextureCommitmentTestCase *this)

{
  ostringstream *this_00;
  uint *puVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  deUint32 err;
  undefined4 extraout_var;
  ostream *poVar6;
  char *description;
  undefined8 unaff_RBP;
  ulong uVar7;
  qpTestResult testResult;
  TestContext *this_01;
  uint uVar8;
  uint uVar9;
  uint *puVar10;
  uint *puVar11;
  GLuint texture;
  undefined1 local_1fc [4];
  uint *local_1f8;
  uint local_1ec;
  string *local_1e8;
  uint *local_1e0;
  long *local_1d8;
  long local_1d0;
  long local_1c8 [2];
  ostream *local_1b8;
  undefined1 local_1b0 [16];
  TestLog local_1a0 [13];
  ios_base local_138 [264];
  long lVar5;
  
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_sparse_texture");
  if (bVar2) {
    iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar5 = CONCAT44(extraout_var,iVar3);
    puVar10 = (uint *)(this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_start;
    if (puVar10 !=
        (uint *)(this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish) {
      local_1e8 = (string *)&this->field_0x90;
      local_1b8 = (ostream *)&this->field_0x88;
      uVar7 = CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
      do {
        puVar11 = (uint *)(this->mSupportedInternalFormats).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
        iVar3 = 5;
        puVar1 = puVar10;
        if (puVar11 !=
            (uint *)(this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_finish) {
          do {
            local_1e0 = puVar1;
            iVar4 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])
                              (this,(ulong)*puVar10,(ulong)*puVar11);
            iVar3 = 7;
            if ((char)iVar4 != '\0') {
              local_1b0._0_8_ = local_1a0;
              local_1f8 = puVar11;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,0x1b32ab9);
              std::__cxx11::stringbuf::str(local_1e8);
              local_1ec = (uint)uVar7;
              if ((TestLog *)local_1b0._0_8_ != local_1a0) {
                operator_delete((void *)local_1b0._0_8_,
                                (ulong)((long)&(local_1a0[0].m_log)->flags + 1));
              }
              poVar6 = local_1b8;
              std::__ostream_insert<char,std::char_traits<char>>
                        (local_1b8,"Testing sparse texture commitment for target: ",0x2e);
              poVar6 = (ostream *)std::ostream::operator<<(poVar6,*puVar10);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,", format: ",10);
              puVar11 = local_1f8;
              poVar6 = (ostream *)std::ostream::operator<<(poVar6,*local_1f8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6," - ",3);
              (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[8])
                        (this,lVar5,(ulong)*puVar10,(ulong)*puVar11,local_1fc,3);
              if (0 < (this->mState).levels) {
                uVar7 = 0;
                do {
                  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[10])
                            (this,lVar5,(ulong)*puVar10,(ulong)*puVar11,local_1fc,uVar7);
                  uVar8 = (int)uVar7 + 1;
                  uVar7 = (ulong)uVar8;
                } while ((int)uVar8 < (this->mState).levels);
              }
              uVar8 = local_1ec;
              if (0 < (this->mState).levels) {
                iVar3 = 1;
                do {
                  uVar9 = iVar3 - 1;
                  iVar4 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0xc]
                          )(this,lVar5,(ulong)*puVar10,(ulong)*local_1f8,local_1fc,(ulong)uVar9);
                  puVar11 = local_1f8;
                  if ((char)iVar4 != '\0') {
                    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[10])
                              (this,lVar5,(ulong)*puVar10,(ulong)*local_1f8,local_1fc,(ulong)uVar9);
                    puVar10 = local_1e0;
                    uVar8 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode
                              [0xb])(this,lVar5,(ulong)*local_1e0,(ulong)*puVar11,local_1fc,
                                     (ulong)uVar9);
                  }
                } while (((uVar8 & 1) != 0) &&
                        (bVar2 = iVar3 < (this->mState).levels, iVar3 = iVar3 + 1, bVar2));
              }
              (**(code **)(lVar5 + 0x480))(1,local_1fc);
              err = (**(code **)(lVar5 + 0x800))();
              glu::checkError(err,"GenTextures",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
                              ,0xd4);
              puVar11 = local_1f8;
              iVar3 = 0;
              uVar7 = 0;
              if ((uVar8 & 1) != 0) {
                iVar4 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0xf])
                                  (this,lVar5,(ulong)*puVar10,(ulong)*local_1f8,local_1fc);
                if ((char)iVar4 == '\0') {
                  uVar7 = 0;
                }
                else {
                  uVar8 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode
                            [0x10])(this,lVar5,(ulong)*puVar10,(ulong)*puVar11,local_1fc);
                  uVar7 = (ulong)uVar8;
                }
              }
              puVar11 = local_1f8;
              if ((char)uVar7 == '\0') {
                local_1b0._0_8_ =
                     ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
                this_00 = (ostringstream *)(local_1b0 + 8);
                std::__cxx11::ostringstream::ostringstream(this_00);
                std::__cxx11::stringbuf::str();
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)this_00,(char *)local_1d8,local_1d0);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Fail",4);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                if (local_1d8 != local_1c8) {
                  operator_delete(local_1d8,local_1c8[0] + 1);
                }
                std::__cxx11::ostringstream::~ostringstream(this_00);
                std::ios_base::~ios_base(local_138);
                iVar3 = 1;
                tcu::TestContext::setTestResult
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                           QP_TEST_RESULT_FAIL,"Fail");
                puVar11 = local_1f8;
              }
            }
            if ((iVar3 != 7) && (iVar3 != 0)) goto LAB_00a61b61;
            puVar11 = puVar11 + 1;
            puVar1 = local_1e0;
          } while (puVar11 !=
                   (uint *)(this->mSupportedInternalFormats).
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish);
          iVar3 = 5;
        }
LAB_00a61b61:
        if ((iVar3 != 5) && (iVar3 != 0)) {
          return STOP;
        }
        puVar10 = puVar10 + 1;
      } while (puVar10 !=
               (uint *)(this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
    }
    this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Pass";
    testResult = QP_TEST_RESULT_PASS;
  }
  else {
    this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_01,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult SparseTextureCommitmentTestCase::iterate()
{
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_sparse_texture"))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");
		return STOP;
	}

	const Functions& gl = m_context.getRenderContext().getFunctions();

	bool result = true;

	GLuint texture;

	for (std::vector<glw::GLint>::const_iterator iter = mSupportedTargets.begin(); iter != mSupportedTargets.end();
		 ++iter)
	{
		const GLint& target = *iter;

		for (std::vector<glw::GLint>::const_iterator formIter = mSupportedInternalFormats.begin();
			 formIter != mSupportedInternalFormats.end(); ++formIter)
		{
			const GLint& format = *formIter;

			if (!caseAllowed(target, format))
				continue;

			mLog.str("");
			mLog << "Testing sparse texture commitment for target: " << target << ", format: " << format << " - ";

			//Checking if written data into not committed region generates no error
			sparseAllocateTexture(gl, target, format, texture, 3);
			for (int l = 0; l < mState.levels; ++l)
				writeDataToTexture(gl, target, format, texture, l);

			//Checking if written data into committed region is as expected
			for (int l = 0; l < mState.levels; ++l)
			{
				if (commitTexturePage(gl, target, format, texture, l))
				{
					writeDataToTexture(gl, target, format, texture, l);
					result = verifyTextureData(gl, target, format, texture, l);
				}

				if (!result)
					break;
			}

			Texture::Delete(gl, texture);

			//verify errors
			result = result && verifyInvalidOperationErrors(gl, target, format, texture);
			result = result && verifyInvalidValueErrors(gl, target, format, texture);

			if (!result)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << mLog.str() << "Fail" << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
				return STOP;
			}
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}